

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O0

ostream * tchecker::output(ostream *os,clock_reset_t *r,clock_index_t *index)

{
  clock_reset_t *pcVar1;
  integer_t iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  ostream *poVar4;
  clock_id_t local_28;
  integer_t value;
  clock_id_t right_id;
  clock_index_t *index_local;
  clock_reset_t *r_local;
  ostream *os_local;
  
  _right_id = index;
  index_local = (clock_index_t *)r;
  r_local = (clock_reset_t *)os;
  value = clock_reset_t::left_id(r);
  pbVar3 = index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::value(index,(uint *)&value);
  std::operator<<(os,(string *)pbVar3);
  std::operator<<((ostream *)r_local,"=");
  local_28 = clock_reset_t::right_id((clock_reset_t *)index_local);
  iVar2 = clock_reset_t::value((clock_reset_t *)index_local);
  if (local_28 == 0x7fffffff) {
    std::ostream::operator<<(r_local,iVar2);
  }
  else {
    if (iVar2 != 0) {
      poVar4 = (ostream *)std::ostream::operator<<(r_local,iVar2);
      std::operator<<(poVar4,"+");
    }
    pcVar1 = r_local;
    pbVar3 = index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value(_right_id,&local_28);
    std::operator<<((ostream *)pcVar1,(string *)pbVar3);
  }
  return (ostream *)r_local;
}

Assistant:

std::ostream & output(std::ostream & os, tchecker::clock_reset_t const & r, tchecker::clock_index_t const & index)
{
  os << index.value(r.left_id());
  os << "=";
  tchecker::clock_id_t right_id = r.right_id();
  tchecker::integer_t value = r.value();
  if (right_id != tchecker::REFCLOCK_ID) {
    if (value != 0)
      os << value << "+";
    os << index.value(right_id);
  }
  else
    os << value;
  return os;
}